

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O3

void Abc_NtkFxInsert(Abc_Ntk_t *pNtk,Vec_Wec_t *vCubes)

{
  size_t __size;
  uint uVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  Abc_Obj_t *pFanin;
  int *piVar5;
  void **ppvVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  Abc_Obj_t *pAVar10;
  void *__s;
  void *__s_00;
  void *__s_01;
  char *pSop;
  ulong uVar11;
  uint uVar12;
  int **ppiVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  Vec_Ptr_t *pVVar17;
  long lVar18;
  long lVar19;
  char *pcVar20;
  ulong uVar21;
  
  if ((pNtk->ntkFunc != ABC_FUNC_SOP) || (pNtk->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                  ,0xba,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
  }
  iVar8 = vCubes->nSize;
  if (0 < (long)iVar8) {
    lVar9 = (long)iVar8 << 4;
    lVar18 = 0;
    iVar16 = -1;
    do {
      if (*(int *)((long)&vCubes->pArray->nSize + lVar18) < 1) {
        __assert_fail("Vec_IntSize(vCube) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                      ,0xbf,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
      }
      iVar15 = **(int **)((long)&vCubes->pArray->pArray + lVar18);
      if (iVar15 < iVar16) {
        __assert_fail("Lit <= Vec_IntEntry(vCube, 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                      ,0xc0,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
      }
      lVar18 = lVar18 + 0x10;
      iVar16 = iVar15;
    } while (lVar9 != lVar18);
    if (0 < iVar8) {
      lVar18 = 0;
      iVar8 = 0;
      do {
        if (*(int *)((long)&vCubes->pArray->nSize + lVar18) < 1) goto LAB_00259ec2;
        iVar16 = **(int **)((long)&vCubes->pArray->pArray + lVar18);
        if (iVar8 <= iVar16) {
          iVar8 = iVar16;
        }
        lVar18 = lVar18 + 0x10;
      } while (lVar9 != lVar18);
      goto LAB_00259a62;
    }
  }
  iVar8 = 0;
LAB_00259a62:
  iVar16 = pNtk->vObjs->nSize;
  if (iVar8 < iVar16) {
    puts("The network is unchanged by fast extract.");
    return;
  }
  do {
    pAVar10 = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
    if (iVar16 != pAVar10->Id) {
      __assert_fail("i == (int)Abc_ObjId(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                    ,0xd0,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
    }
    iVar16 = iVar16 + 1;
  } while (iVar8 + 1 != iVar16);
  pVVar17 = pNtk->vObjs;
  uVar1 = pVVar17->nSize;
  lVar9 = (long)(int)uVar1;
  uVar7 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar7 = uVar1;
  }
  if (uVar7 == 0) {
    __s = (void *)0x0;
    memset((void *)0x0,0,lVar9 * 4);
    __s_00 = (void *)0x0;
  }
  else {
    __size = (long)(int)uVar7 * 4;
    __s = malloc(__size);
    memset(__s,0,lVar9 * 4);
    __s_00 = malloc(__size);
  }
  memset(__s_00,0,lVar9 * 4);
  iVar8 = vCubes->nSize;
  if (0 < (long)iVar8) {
    ppiVar13 = &vCubes->pArray->pArray;
    lVar18 = 0;
    do {
      if (*(int *)((long)ppiVar13 + -4) < 1) goto LAB_00259ec2;
      lVar19 = (long)**ppiVar13;
      if ((lVar19 < 0) || ((int)uVar1 <= **ppiVar13)) goto LAB_00259ec2;
      iVar16 = *(int *)((long)__s_00 + lVar19 * 4);
      if (iVar16 == 0) {
        *(int *)((long)__s + lVar19 * 4) = (int)lVar18;
      }
      *(int *)((long)__s_00 + lVar19 * 4) = iVar16 + 1;
      lVar18 = lVar18 + 1;
      ppiVar13 = ppiVar13 + 2;
    } while (iVar8 != lVar18);
  }
  if (uVar7 == 0) {
    __s_01 = (void *)0x0;
  }
  else {
    __s_01 = malloc((long)(int)uVar7 << 2);
  }
  memset(__s_01,0xff,lVar9 * 4);
  if (0 < (int)uVar1) {
    uVar14 = 0;
    do {
      pAVar10 = (Abc_Obj_t *)pVVar17->pArray[uVar14];
      if ((pAVar10 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar10->field_0x14 & 0xf) == 7)) {
        Abc_ObjRemoveFanins(pAVar10);
        if (lVar9 <= (long)uVar14) {
LAB_00259ec2:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar8 = *(int *)((long)__s_00 + uVar14 * 4);
        if (iVar8 < 1) {
          __assert_fail("Vec_IntEntry(vCount, i) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                        ,0xe3,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
        }
        iVar16 = 0;
        do {
          uVar7 = *(int *)((long)__s + uVar14 * 4) + iVar16;
          if (((int)uVar7 < 0) || (vCubes->nSize <= (int)uVar7)) goto LAB_00259f3e;
          pVVar4 = vCubes->pArray;
          iVar15 = pVVar4[uVar7].nSize;
          if (iVar15 < 1) goto LAB_00259ec2;
          if (uVar14 != (uint)*pVVar4[uVar7].pArray) {
            __assert_fail("Vec_IntEntry( vCube, 0 ) == i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                          ,0xe7,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
          }
          if (iVar15 != 1) {
            lVar18 = 1;
            do {
              if (pVVar4[uVar7].pArray[lVar18] < 0) goto LAB_00259ee1;
              uVar12 = (uint)pVVar4[uVar7].pArray[lVar18] >> 1;
              if (pNtk->vObjs->nSize <= (int)uVar12) goto LAB_00259f00;
              pFanin = (Abc_Obj_t *)pNtk->vObjs->pArray[uVar12];
              uVar12 = pFanin->Id;
              if (uVar1 <= uVar12) goto LAB_00259ec2;
              if (*(int *)((long)__s_01 + (ulong)uVar12 * 4) < 0) {
                *(int *)((long)__s_01 + (ulong)uVar12 * 4) = (pAVar10->vFanins).nSize;
                Abc_ObjAddFanin(pAVar10,pFanin);
                iVar15 = pVVar4[uVar7].nSize;
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 < iVar15);
            iVar8 = *(int *)((long)__s_00 + uVar14 * 4);
          }
          iVar16 = iVar16 + 1;
        } while (iVar16 < iVar8);
        pSop = Abc_SopStart((Mem_Flex_t *)pNtk->pManFunc,iVar8,(pAVar10->vFanins).nSize);
        iVar8 = *(int *)((long)__s_00 + uVar14 * 4);
        if (0 < iVar8) {
          iVar16 = *(int *)((long)__s + uVar14 * 4);
          iVar15 = 0;
          pcVar20 = pSop;
          do {
            uVar7 = iVar16 + iVar15;
            if (((int)uVar7 < 0) || (vCubes->nSize <= (int)uVar7)) {
LAB_00259f3e:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                            ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
            }
            pVVar4 = vCubes->pArray;
            if (pVVar4[uVar7].nSize < 1) goto LAB_00259ec2;
            if (uVar14 != (uint)*pVVar4[uVar7].pArray) {
              __assert_fail("Vec_IntEntry( vCube, 0 ) == i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                            ,0xf6,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
            }
            if (pVVar4[uVar7].nSize != 1) {
              lVar18 = 1;
              do {
                uVar12 = pVVar4[uVar7].pArray[lVar18];
                if ((int)uVar12 < 0) {
LAB_00259ee1:
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                                ,0x10c,"int Abc_Lit2Var(int)");
                }
                if (pNtk->vObjs->nSize <= (int)(uVar12 >> 1)) {
LAB_00259f00:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                uVar2 = *(uint *)((long)pNtk->vObjs->pArray[uVar12 >> 1] + 0x10);
                if (uVar1 <= uVar2) goto LAB_00259ec2;
                iVar3 = *(int *)((long)__s_01 + (ulong)uVar2 * 4);
                if (((long)iVar3 < 0) || ((pAVar10->vFanins).nSize <= iVar3)) {
                  __assert_fail("iFanin >= 0 && iFanin < Abc_ObjFaninNum(pNode)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                                ,0xfb,"void Abc_NtkFxInsert(Abc_Ntk_t *, Vec_Wec_t *)");
                }
                pcVar20[iVar3] = (byte)uVar12 & 1 ^ 0x31;
                lVar18 = lVar18 + 1;
              } while (lVar18 < pVVar4[uVar7].nSize);
            }
            pcVar20 = pcVar20 + (long)(pAVar10->vFanins).nSize + 3;
            iVar15 = iVar15 + 1;
          } while (iVar15 < iVar8);
        }
        if (((char *)(pAVar10->field_5).pData != (char *)0x0) &&
           (iVar8 = Abc_SopIsComplement((char *)(pAVar10->field_5).pData), iVar8 != 0)) {
          Abc_SopComplement(pSop);
        }
        (pAVar10->field_5).pData = pSop;
        uVar11 = (ulong)(pAVar10->vFanins).nSize;
        if (0 < (long)uVar11) {
          piVar5 = (pAVar10->vFanins).pArray;
          ppvVar6 = pAVar10->pNtk->vObjs->pArray;
          uVar21 = 0;
          do {
            uVar7 = *(uint *)((long)ppvVar6[piVar5[uVar21]] + 0x10);
            if (uVar1 <= uVar7) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            *(undefined4 *)((long)__s_01 + (ulong)uVar7 * 4) = 0xffffffff;
            uVar21 = uVar21 + 1;
          } while (uVar21 < uVar11);
        }
      }
      uVar14 = uVar14 + 1;
      pVVar17 = pNtk->vObjs;
    } while ((long)uVar14 < (long)pVVar17->nSize);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (__s_00 != (void *)0x0) {
    free(__s_00);
  }
  if (__s_01 == (void *)0x0) {
    return;
  }
  free(__s_01);
  return;
}

Assistant:

void Abc_NtkFxInsert( Abc_Ntk_t * pNtk, Vec_Wec_t * vCubes )
{
    Vec_Int_t * vCube, * vPres, * vFirst, * vCount;
    Abc_Obj_t * pNode, * pFanin;
    char * pCube, * pSop;
    int i, k, v, Lit, iFanin, iNodeMax = 0;
    assert( Abc_NtkIsSopLogic(pNtk) );
    // check that cubes have no gaps and are ordered by first node
    Lit = -1;
    Vec_WecForEachLevel( vCubes, vCube, i )
    {
        assert( Vec_IntSize(vCube) > 0 );
        assert( Lit <= Vec_IntEntry(vCube, 0) );
        Lit = Vec_IntEntry(vCube, 0);
    }
    // find the largest index
    Vec_WecForEachLevel( vCubes, vCube, i )
        iNodeMax = Abc_MaxInt( iNodeMax, Vec_IntEntry(vCube, 0) );
    // quit if nothing changes
    if ( iNodeMax < Abc_NtkObjNumMax(pNtk) )
    {
        printf( "The network is unchanged by fast extract.\n" );
        return;
    }
    // create new nodes
    for ( i = Abc_NtkObjNumMax(pNtk); i <= iNodeMax; i++ )
    {
        pNode = Abc_NtkCreateNode( pNtk );
        assert( i == (int)Abc_ObjId(pNode) );
    }
    // create node fanins
    vFirst = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    vCount = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    Vec_WecForEachLevel( vCubes, vCube, i )
    {
        iFanin = Vec_IntEntry( vCube, 0 );
        if ( Vec_IntEntry(vCount, iFanin) == 0 )
            Vec_IntWriteEntry( vFirst, iFanin, i );
        Vec_IntAddToEntry( vCount, iFanin, 1 );
    }
    // create node SOPs
    vPres = Vec_IntStartFull( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
//        if ( Vec_IntEntry(vCount, i) == 0 ) continue;
        Abc_ObjRemoveFanins( pNode );
        // create fanins
        assert( Vec_IntEntry(vCount, i) > 0 );
        for ( k = 0; k < Vec_IntEntry(vCount, i); k++ )
        {
            vCube = Vec_WecEntry( vCubes, Vec_IntEntry(vFirst, i) + k );
            assert( Vec_IntEntry( vCube, 0 ) == i );
            Vec_IntForEachEntryStart( vCube, Lit, v, 1 )
            {
                pFanin = Abc_NtkObj(pNtk, Abc_Lit2Var(Lit));
                if ( Vec_IntEntry(vPres, Abc_ObjId(pFanin)) >= 0 )
                    continue;
                Vec_IntWriteEntry(vPres, Abc_ObjId(pFanin), Abc_ObjFaninNum(pNode));
                Abc_ObjAddFanin( pNode, pFanin );
            }
        }
        // create SOP
        pSop = pCube = Abc_SopStart( (Mem_Flex_t *)pNtk->pManFunc, Vec_IntEntry(vCount, i), Abc_ObjFaninNum(pNode) );
        for ( k = 0; k < Vec_IntEntry(vCount, i); k++ )
        {
            vCube = Vec_WecEntry( vCubes, Vec_IntEntry(vFirst, i) + k );
            assert( Vec_IntEntry( vCube, 0 ) == i );
            Vec_IntForEachEntryStart( vCube, Lit, v, 1 )
            {
                pFanin = Abc_NtkObj(pNtk, Abc_Lit2Var(Lit));
                iFanin = Vec_IntEntry(vPres, Abc_ObjId(pFanin));
                assert( iFanin >= 0 && iFanin < Abc_ObjFaninNum(pNode) );
                pCube[iFanin] = Abc_LitIsCompl(Lit) ? '0' : '1';
            }
            pCube += Abc_ObjFaninNum(pNode) + 3;
        }
        // complement SOP if the original one was complemented
        if ( pNode->pData && Abc_SopIsComplement((char *)pNode->pData) )
            Abc_SopComplement( pSop );
        pNode->pData = pSop;
        // clean fanins
        Abc_ObjForEachFanin( pNode, pFanin, v )
            Vec_IntWriteEntry( vPres, Abc_ObjId(pFanin), -1 );
    }
    Vec_IntFree( vFirst );
    Vec_IntFree( vCount );
    Vec_IntFree( vPres );
}